

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O3

FormalArgumentSymbol * __thiscall
slang::ast::MethodBuilder::addArg
          (MethodBuilder *this,string_view name,Type *type,ArgumentDirection direction,
          optional<slang::SVInt> *defaultValue)

{
  FormalArgumentSymbol *pFVar1;
  Expression *pEVar2;
  FormalArgumentSymbol *arg;
  FormalArgumentSymbol *local_40;
  ArgumentDirection local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = name._M_str;
  local_30._M_len = name._M_len;
  local_40 = (FormalArgumentSymbol *)((ulong)local_40 & 0xffffffff00000000);
  local_34 = direction;
  local_40 = BumpAllocator::
             emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime>
                       (&this->compilation->super_BumpAllocator,&local_30,
                        (SourceLocation *)&SourceLocation::NoLocation,&local_34,
                        (VariableLifetime *)&local_40);
  (local_40->super_VariableSymbol).super_ValueSymbol.declaredType.type = type;
  Scope::insertMember(&this->symbol->super_Scope,(Symbol *)local_40,
                      (this->symbol->super_Scope).lastMember,false,true);
  SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
  emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
            ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)&this->args,&local_40);
  pFVar1 = local_40;
  if ((defaultValue->super__Optional_base<slang::SVInt,_false,_false>)._M_payload.
      super__Optional_payload<slang::SVInt,_true,_false,_false>.
      super__Optional_payload_base<slang::SVInt>._M_engaged == true) {
    pEVar2 = IntegerLiteral::fromConstant(this->compilation,(SVInt *)defaultValue);
    pFVar1->defaultVal = pEVar2;
    pFVar1->defaultValSyntax = (ExpressionSyntax *)0x0;
  }
  return local_40;
}

Assistant:

FormalArgumentSymbol& MethodBuilder::addArg(std::string_view name, const Type& type,
                                            ArgumentDirection direction,
                                            std::optional<SVInt> defaultValue) {
    auto arg = compilation.emplace<FormalArgumentSymbol>(name, NL, direction,
                                                         VariableLifetime::Automatic);
    arg->setType(type);
    symbol.addMember(*arg);
    args.push_back(arg);

    if (defaultValue) {
        SLANG_ASSERT(type.isIntegral());
        arg->setDefaultValue(&IntegerLiteral::fromConstant(compilation, *defaultValue));
    }

    return *arg;
}